

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  pointer pcVar1;
  const_iterator __position;
  TargetPropertyEntryVector *pTVar2;
  cmake *propertyValue;
  undefined1 local_d0 [8];
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *local_c8;
  _Base_ptr local_c0;
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> local_b8;
  pointer ppcStack_b0;
  pointer local_a8;
  _Base_ptr local_a0;
  undefined1 local_98 [8];
  _Base_ptr p_Stack_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  element_type *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_60;
  _Alloc_hider _Stack_50;
  element_type *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  this_00 = this->Target;
  pcVar1 = (src->_M_dataplus)._M_p;
  local_a8 = (pointer)local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  if (local_a8 == (pointer)local_98) {
    local_78._8_8_ = p_Stack_90;
    local_88._0_8_ = local_88 + 0x10;
  }
  else {
    local_88._0_8_ = local_a8;
  }
  local_78._M_allocated_capacity._1_7_ = local_98._1_7_;
  local_78._M_local_buf[0] = local_98[0];
  local_88._8_8_ = local_a0;
  local_a0 = (_Base_ptr)0x0;
  local_98[0] = _S_red;
  local_68 = local_48;
  aStack_60._M_allocated_capacity = aStack_40._M_allocated_capacity;
  local_48 = (element_type *)0x0;
  aStack_40._M_allocated_capacity = 0;
  local_a8 = (pointer)local_98;
  cmTarget::InsertInclude
            (this_00,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_88,before);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_60._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_60._M_allocated_capacity);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40._M_allocated_capacity);
  }
  if (local_a8 != (pointer)local_98) {
    operator_delete(local_a8,CONCAT71(local_98._1_7_,local_98[0]) + 1);
  }
  pTVar2 = (TargetPropertyEntryVector *)
           &(this->IncludeDirectoriesEntries).
            super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (before) {
    pTVar2 = &this->IncludeDirectoriesEntries;
  }
  __position._M_current =
       (pTVar2->
       super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  propertyValue = cmMakefile::GetCMakeInstance(this->Makefile);
  pcVar1 = (src->_M_dataplus)._M_p;
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  local_88._0_8_ = local_88 + 0x10;
  if (local_c8 == &local_b8) {
    local_78._8_8_ = ppcStack_b0;
  }
  else {
    local_88._0_8_ = local_c8;
  }
  local_78._M_allocated_capacity._1_7_ =
       local_b8._M_t.
       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._1_7_;
  local_78._M_local_buf[0] =
       local_b8._M_t.
       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._0_1_;
  local_88._8_8_ = local_c0;
  local_c0 = (_Base_ptr)0x0;
  local_b8._M_t.
  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._0_1_ = 0;
  local_68 = (element_type *)aStack_60._8_8_;
  aStack_60._M_allocated_capacity = (size_type)_Stack_50._M_p;
  aStack_60._8_8_ = 0;
  _Stack_50._M_p = (pointer)0x0;
  local_c8 = &local_b8;
  CreateTargetPropertyEntry
            ((cmake *)local_d0,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )propertyValue,SUB81(local_88,0));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::_M_insert_rval(&this->IncludeDirectoriesEntries,__position,(value_type *)local_d0);
  if ((tuple<cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
       )local_d0 != (_Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>)0x0) {
    (**(code **)((long)*(__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)local_d0 + 8))();
  }
  local_d0 = (undefined1  [8])0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_60._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_60._M_allocated_capacity);
  }
  if ((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *)
      local_88._0_8_ !=
      (unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *)
      (local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(local_b8._M_t.
                                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                      _M_head_impl._1_7_,
                                      local_b8._M_t.
                                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                      _M_head_impl._0_1_) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(
    BT<std::string>(src, this->Makefile->GetBacktrace()), before);
  this->IncludeDirectoriesEntries.insert(
    before ? this->IncludeDirectoriesEntries.begin()
           : this->IncludeDirectoriesEntries.end(),
    CreateTargetPropertyEntry(
      *this->Makefile->GetCMakeInstance(),
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
}